

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O1

void StoreLevelStats(void)

{
  undefined1 auVar1 [16];
  FString __s2;
  OneLevel *pOVar2;
  uint uVar3;
  int iVar4;
  DThinker *pDVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  FString *pFVar9;
  TThinkerIterator<AActor> it;
  FThinkerIterator FStack_48;
  
  uVar3 = LevelData.Count;
  __s2.Chars = level.MapName.Chars;
  if ((gamestate == GS_LEVEL) && ((level.flags2._3_1_ & 0x10) == 0)) {
    uVar6 = (ulong)LevelData.Count;
    if (uVar6 == 0) {
      uVar8 = 0;
    }
    else {
      pFVar9 = &(LevelData.Array)->Levelname;
      uVar7 = 0;
      do {
        iVar4 = strcasecmp(pFVar9->Chars,__s2.Chars);
        uVar8 = uVar7;
        if (iVar4 == 0) break;
        uVar7 = uVar7 + 1;
        pFVar9 = pFVar9 + 4;
        uVar8 = uVar6;
      } while (uVar6 != uVar7);
    }
    uVar6 = uVar8 & 0xffffffff;
    if ((uint)uVar8 == uVar3) {
      TArray<OneLevel,_OneLevel>::Reserve(&LevelData,1);
      FString::operator=(&LevelData.Array[uVar6].Levelname,&level.MapName);
    }
    pOVar2 = LevelData.Array;
    LevelData.Array[uVar6].totalkills = level.total_monsters;
    pOVar2[uVar6].killcount = level.killed_monsters;
    pOVar2[uVar6].totalsecrets = level.total_secrets;
    pOVar2[uVar6].secretcount = level.found_secrets;
    auVar1 = SEXT816((long)level.maptime * 0x62) * ZEXT816(0xa3d70a3d70a3d70b);
    pOVar2[uVar6].leveltime = (int)(auVar1._8_8_ >> 6) - (auVar1._12_4_ >> 0x1f);
    FThinkerIterator::FThinkerIterator(&FStack_48,AActor::RegistrationInfo.MyClass,0x80);
    iVar4 = 0;
    pDVar5 = FThinkerIterator::Next(&FStack_48,false);
    if (pDVar5 != (DThinker *)0x0) {
      do {
        if (((ulong)pDVar5[7].PrevThinker & 0x40000000000000) != 0) {
          iVar4 = iVar4 + (uint)(0 < *(int *)((long)&pDVar5[9].super_DObject._vptr_DObject + 4));
        }
        pDVar5 = FThinkerIterator::Next(&FStack_48,false);
      } while (pDVar5 != (DThinker *)0x0);
      if (iVar4 != 0) {
        return;
      }
    }
    LevelData.Array[uVar6].killcount = LevelData.Array[uVar6].totalkills;
  }
  return;
}

Assistant:

static void StoreLevelStats()
{
	unsigned int i;

	if (gamestate != GS_LEVEL) return;

	if (!(level.flags2&LEVEL2_NOSTATISTICS))	// don't consider maps that were excluded from statistics
	{
		for(i=0;i<LevelData.Size();i++)
		{
			if (!LevelData[i].Levelname.CompareNoCase(level.MapName)) break;
		}
		if (i==LevelData.Size())
		{
			LevelData.Reserve(1);
			LevelData[i].Levelname = level.MapName;
		}
		LevelData[i].totalkills = level.total_monsters;
		LevelData[i].killcount = level.killed_monsters;
		LevelData[i].totalsecrets = level.total_secrets;
		LevelData[i].secretcount = level.found_secrets;
		LevelData[i].leveltime = AdjustTics(level.maptime);

		// Check for living monsters. On some maps it can happen
		// that the counter misses some. 
		TThinkerIterator<AActor> it;
		AActor *ac;
		int mc = 0;

		while ((ac = it.Next()))
		{
			if ((ac->flags & MF_COUNTKILL) && ac->health > 0) mc++;
		}
		if (mc == 0) LevelData[i].killcount = LevelData[i].totalkills;
	}
}